

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_clause_simplification_rule.cpp
# Opt level: O1

void __thiscall
duckdb::InClauseSimplificationRule::InClauseSimplificationRule
          (InClauseSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::InClauseExpressionMatcher_*,_false> _Var2;
  pointer pIVar3;
  pointer *__ptr;
  templated_unique_single_t op;
  _Head_base<0UL,_duckdb::InClauseExpressionMatcher_*,_false> local_18;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_02476618;
  local_18._M_head_impl = (InClauseExpressionMatcher *)operator_new(0x40);
  ((local_18._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_OPERATOR;
  ((local_18._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (__uniq_ptr_data<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true,_true>
          )0x0;
  ((local_18._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (__uniq_ptr_data<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true,_true>)
       0x0;
  ((local_18._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__InClauseExpressionMatcher_02476228;
  ((ExpressionMatcher *)&(local_18._M_head_impl)->matchers)->_vptr_ExpressionMatcher =
       (_func_int **)0x0;
  *(undefined8 *)&((ExpressionMatcher *)&(local_18._M_head_impl)->matchers)->expr_class = 0;
  (((ExpressionMatcher *)&(local_18._M_head_impl)->matchers)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t = (__uniq_ptr_data<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true,_true>
           )0x0;
  pIVar3 = unique_ptr<duckdb::InClauseExpressionMatcher,_std::default_delete<duckdb::InClauseExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::InClauseExpressionMatcher,_std::default_delete<duckdb::InClauseExpressionMatcher>,_true>
                         *)&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  pIVar3->policy = SOME;
  local_18._M_head_impl = (InClauseExpressionMatcher *)0x0;
  _Var1._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_ExpressionMatcher;
  if (_Var1._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_18._M_head_impl != (InClauseExpressionMatcher *)0x0) {
    (*((local_18._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

InClauseSimplificationRule::InClauseSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on InClauseExpression that has a ConstantExpression as a check
	auto op = make_uniq<InClauseExpressionMatcher>();
	op->policy = SetMatcher::Policy::SOME;
	root = std::move(op);
}